

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeStiffnessMatrix(ChElementTetraCorot_10 *this)

{
  ChMatrixDynamic<> *this_00;
  double JacobianDet;
  ChMatrixDynamic<> temp;
  ChMatrixNM<double,_4,_4> tmp;
  double local_1a0;
  double local_198;
  Matrix<double,__1,__1,_1,__1,__1> local_190;
  pointer local_170;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_168;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_150;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
  local_140;
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  local_168.m_lhs.m_lhs.m_matrix = &local_190;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,0
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_168);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  local_168.m_lhs.m_lhs.m_matrix = &local_190;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,1
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_168);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  local_168.m_lhs.m_lhs.m_matrix = &local_190;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,2
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_168);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  local_168.m_lhs.m_lhs.m_matrix = &local_190;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,3
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_168);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true,_true> *)
                  &local_140,&local_100,3);
  local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)&DAT_3ff0000000000000;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true>_>::setConstant
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true>_> *)
             &local_140,(Scalar *)&local_190);
  local_140._0_8_ = &local_100;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,4,1,4,4>,Eigen::Inverse<Eigen::Matrix<double,4,4,1,4,4>>>
            (&this->mM,(Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_140);
  local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
            (0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,this,
             (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_198);
  local_1a0 = (local_198 / 6.0) * 0.0625;
  local_170 = (this->MatrB).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_150 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_170,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                         &((this->Material).
                           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->StressStrainMatrix);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product(&local_168,&local_150,
            (this->MatrB).
            super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
  Eigen::operator*(&local_140,&local_1a0,(StorageBaseType *)&local_168);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>const>>
            (&local_190,&local_140);
  this_00 = &this->StiffnessMatrix;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (this_00,&local_190);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
            (0x3fc1b06d1ab58dec,0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,this,
             (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,&local_198);
  local_1a0 = (local_198 / 6.0) * 0.0625;
  local_170 = (this->MatrB).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
  local_150 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_170,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                         &((this->Material).
                           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->StressStrainMatrix);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product(&local_168,&local_150,
            (this->MatrB).
            super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1);
  Eigen::operator*(&local_140,&local_1a0,(StorageBaseType *)&local_168);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>const>>
            (&local_190,&local_140);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)this_00,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_190);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
            (0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,this,
             (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,&local_198);
  local_1a0 = (local_198 / 6.0) * 0.0625;
  local_170 = (this->MatrB).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
  local_150 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_170,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                         &((this->Material).
                           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->StressStrainMatrix);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product(&local_168,&local_150,
            (this->MatrB).
            super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 2);
  Eigen::operator*(&local_140,&local_1a0,(StorageBaseType *)&local_168);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>const>>
            (&local_190,&local_140);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)this_00,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_190);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
            (0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,0x3fe2bbae2bf7d58f,this,
             (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,&local_198);
  local_1a0 = (local_198 / 6.0) * 0.0625;
  local_170 = (this->MatrB).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3;
  local_150 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_170,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                         &((this->Material).
                           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->StressStrainMatrix);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product(&local_168,&local_150,
            (this->MatrB).
            super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 3);
  Eigen::operator*(&local_140,&local_1a0,(StorageBaseType *)&local_168);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>const>>
            (&local_190,&local_140);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)this_00,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_190);
  local_140._0_8_ = (XprTypeNested)0x4000000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this_00,(Scalar *)&local_140);
  Eigen::internal::handmade_aligned_free
            (local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementTetraCorot_10::ComputeStiffnessMatrix() {
    // for speeding up corotational, used later:
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetX0().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetX0().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetX0().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetX0().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    //========================
    // Exact Integration (4 Gp)
    //========================
    ChMatrixDynamic<> temp;

    double zeta1 = 0.58541020;
    double zeta2 = 0.1381966;
    double zeta3 = 0.1381966;
    double zeta4 = 0.1381966;
    double JacobianDet;
    ComputeMatrB(this->MatrB[0], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[0].transpose() * Material->Get_StressStrainMatrix() * MatrB[0]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix = temp;

    zeta1 = 0.1381966;
    zeta2 = 0.58541020;
    zeta3 = 0.1381966;
    zeta4 = 0.1381966;
    ComputeMatrB(this->MatrB[1], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[1].transpose() * Material->Get_StressStrainMatrix() * MatrB[1]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    zeta1 = 0.1381966;
    zeta2 = 0.1381966;
    zeta3 = 0.58541020;
    zeta4 = 0.1381966;
    ComputeMatrB(this->MatrB[2], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[2].transpose() * Material->Get_StressStrainMatrix() * MatrB[2]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    zeta1 = 0.1381966;
    zeta2 = 0.1381966;
    zeta3 = 0.1381966;
    zeta4 = 0.58541020;
    ComputeMatrB(this->MatrB[3], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[3].transpose() * Material->Get_StressStrainMatrix() * MatrB[3]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    StiffnessMatrix /= 2;  //!!! => because the canonical interval is -1 ... +1,  but we want to integrate
                           //		 in 0 ... +1 -> we have to multiply by: b-a/2 ( = (1-0)/2 = 1/2)
}